

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

Buffer __thiscall xmrig::Buffer::fromHex(Buffer *this,char *data,size_t size)

{
  bool bVar1;
  uint8_t *out;
  Buffer *pBVar2;
  size_t extraout_RDX;
  ulong __n;
  Buffer BVar3;
  Buffer local_38;
  
  if (data == (char *)0x0 || (size & 1) != 0) {
    this->m_data = (char *)0x0;
    this->m_size = 0;
  }
  else {
    __n = size >> 1;
    local_38.m_size = __n;
    out = (uint8_t *)operator_new__(__n);
    memset(out,0,__n);
    local_38.m_data = (char *)out;
    bVar1 = fromHex((uint8_t *)data,size,out);
    pBVar2 = this;
    if (bVar1) {
      this->m_data = (char *)out;
      this->m_size = __n;
      pBVar2 = &local_38;
    }
    pBVar2->m_data = (char *)0x0;
    pBVar2->m_size = 0;
    ~Buffer(&local_38);
    size = extraout_RDX;
  }
  BVar3.m_size = size;
  BVar3.m_data = (char *)this;
  return BVar3;
}

Assistant:

xmrig::Buffer xmrig::Buffer::fromHex(const char *data, size_t size)
{
    if (data == nullptr || size % 2 != 0) {
        return {};
    }

    Buffer buf(size / 2);
    if (!fromHex(data, size, buf.data())) {
        return {};
    }

    return buf;
}